

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O3

string * __thiscall
options2f::help_abi_cxx11_(string *__return_storage_ptr__,options2f *this,char *prog)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  this->valid = false;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Free energy of ferromagnetic Ising model\n","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
  local_1d0 = &local_1c0;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_1c0 = *plVar3;
    lStack_1b8 = plVar2[3];
  }
  else {
    local_1c0 = *plVar3;
    local_1d0 = (long *)*plVar2;
  }
  local_1c8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  local_1b0 = &local_1a0;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_1a0 = *plVar3;
    lStack_198 = plVar2[3];
  }
  else {
    local_1a0 = *plVar3;
    local_1b0 = (long *)*plVar2;
  }
  local_1a8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  local_190 = &local_180;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_180 = *plVar3;
    lStack_178 = plVar2[3];
  }
  else {
    local_180 = *plVar3;
    local_190 = (long *)*plVar2;
  }
  local_188 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_190);
  local_170 = &local_160;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_160 = *plVar3;
    lStack_158 = plVar2[3];
  }
  else {
    local_160 = *plVar3;
    local_170 = (long *)*plVar2;
  }
  local_168 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_170);
  local_150 = &local_140;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_140 = *plVar3;
    lStack_138 = plVar2[3];
  }
  else {
    local_140 = *plVar3;
    local_150 = (long *)*plVar2;
  }
  local_148 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_130 = &local_120;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_120 = *plVar3;
    lStack_118 = plVar2[3];
  }
  else {
    local_120 = *plVar3;
    local_130 = (long *)*plVar2;
  }
  local_128 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_110 = &local_100;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_100 = *plVar3;
    lStack_f8 = plVar2[3];
  }
  else {
    local_100 = *plVar3;
    local_110 = (long *)*plVar2;
  }
  local_108 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_f0 = &local_e0;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_e0 = *plVar3;
    lStack_d8 = plVar2[3];
  }
  else {
    local_e0 = *plVar3;
    local_f0 = (long *)*plVar2;
  }
  local_e8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c0 = *plVar3;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar3;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a0 = *plVar3;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar3;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string help(char *prog) {
    valid = false;
    return std::string("Free energy of ferromagnetic Ising model\n") +
           "Usage: " + prog + " [-p prec] L T\n" + "       " + prog +
           " [-p prec] L J T\n" + "       " + prog +
           " [-p prec] Lx Ly Jx Jy T\n" + "       " + prog +
           " [-p prec] Lx Ly Jx Jy Tmin Tmax dT\n" +
           "Note: T can be specified as \"tc\" instead of real numbers\n";
  }